

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool __thiscall pugi::xml_node::remove_attributes(xml_node *this)

{
  xml_node_struct *pxVar1;
  xml_allocator *alloc;
  xml_attribute_struct *pxVar2;
  xml_attribute_struct *a;
  
  pxVar1 = this->_root;
  if (pxVar1 != (xml_node_struct *)0x0) {
    alloc = *(xml_allocator **)((long)pxVar1 - (pxVar1->header >> 8));
    a = pxVar1->first_attribute;
    while (a != (xml_attribute_struct *)0x0) {
      pxVar2 = a->next_attribute;
      impl::anon_unknown_0::destroy_attribute(a,alloc);
      a = pxVar2;
    }
    this->_root->first_attribute = (xml_attribute_struct *)0x0;
  }
  return pxVar1 != (xml_node_struct *)0x0;
}

Assistant:

PUGI__FN bool xml_node::remove_attributes()
	{
		if (!_root) return false;

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return false;

		for (xml_attribute_struct* attr = _root->first_attribute; attr; )
		{
			xml_attribute_struct* next = attr->next_attribute;

			impl::destroy_attribute(attr, alloc);

			attr = next;
		}

		_root->first_attribute = 0;

		return true;
	}